

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void SaveIniSettingsToDisk(char *ini_filename)

{
  ImGuiContext *pIVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  value_type *pvVar5;
  FILE *__s;
  int handler_n;
  int i;
  ImVector<char> local_48;
  ImVector<char> local_38;
  
  pIVar1 = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  if (ini_filename != (char *)0x0) {
    local_48.Size = 0;
    local_48.Capacity = 0;
    local_48.Data = (char *)0x0;
    pIVar1->SettingsDirtyTimer = 0.0;
    ImGuiTextBuffer::ImGuiTextBuffer((ImGuiTextBuffer *)&local_38);
    for (i = 0; i < (pIVar1->SettingsHandlers).Size; i = i + 1) {
      pvVar5 = ImVector<ImGuiSettingsHandler>::operator[](&pIVar1->SettingsHandlers,i);
      (*pvVar5->WriteAllFn)(pIVar1,pvVar5,(ImGuiTextBuffer *)&local_38);
    }
    ImVector<char>::pop_back(&local_38);
    pcVar4 = local_38.Data;
    uVar2 = local_38._0_8_;
    local_38.Size = local_48.Size;
    local_38.Capacity = local_48.Capacity;
    uVar3 = local_38._0_8_;
    local_38.Data = local_48.Data;
    local_38.Size = (int)uVar2;
    local_38.Capacity = SUB84(uVar2,4);
    local_48.Size = local_38.Size;
    local_48.Capacity = local_38.Capacity;
    local_48.Data = pcVar4;
    local_38._0_8_ = uVar3;
    ImVector<char>::~ImVector(&local_38);
    __s = fopen(ini_filename,"wt");
    if (__s != (FILE *)0x0) {
      fwrite(local_48.Data,1,(long)local_48.Size,__s);
      fclose(__s);
    }
    ImVector<char>::~ImVector(&local_48);
  }
  return;
}

Assistant:

static void SaveIniSettingsToDisk(const char* ini_filename)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    if (!ini_filename)
        return;

    ImVector<char> buf;
    SaveIniSettingsToMemory(buf);

    FILE* f = ImFileOpen(ini_filename, "wt");
    if (!f)
        return;
    fwrite(buf.Data, sizeof(char), (size_t)buf.Size, f);
    fclose(f);
}